

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_short,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  ulong *puVar1;
  float fVar2;
  ulong uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong *puVar11;
  ushort uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  iVar10 = k->v1;
  iVar7 = k->v2;
  if (iVar10 != iVar7) {
    fVar2 = k->A;
    do {
      iVar9 = k->rowlen - iVar10;
      iVar8 = iVar9 - k->w2;
      if (iVar8 < k->u1) {
        iVar8 = k->u1;
      }
      iVar9 = iVar9 - k->w1;
      if (k->u2 < iVar9) {
        iVar9 = k->u2;
      }
      if (0 < iVar9 - iVar8) {
        puVar11 = (ulong *)((long)data + (long)((k->rowlen * iVar10 + iVar8) * 4) * 2);
        puVar1 = (ulong *)((long)puVar11 + (long)((iVar9 - iVar8) * 4) * 2);
        fVar14 = (float)iVar8 - k->u;
        fVar13 = (float)iVar10 - k->v;
        fVar15 = fVar14 * k->A * fVar14 + (k->B * fVar14 + k->C * fVar13) * fVar13;
        fVar13 = (fVar14 + fVar14 + 1.0) * k->A + fVar13 * k->B;
        do {
          if (fVar15 < 1.0) {
            fVar14 = expf(fVar15 * -6.125);
            fVar14 = fVar14 * k->wscale;
            k->weight = k->weight + fVar14;
            uVar3 = *puVar11;
            uVar12 = (ushort)(uVar3 >> 0x30);
            auVar5._8_4_ = 0;
            auVar5._0_8_ = uVar3;
            auVar5._12_2_ = uVar12;
            auVar6._8_2_ = (short)(uVar3 >> 0x20);
            auVar6._0_8_ = uVar3;
            auVar6._10_4_ = auVar5._10_4_;
            auVar4._2_10_ = SUB1610(ZEXT616(auVar6._8_6_) << 0x40,6);
            auVar4._0_2_ = (short)(uVar3 >> 0x10);
            *result = fVar14 * (float)(ushort)uVar3 + *result;
            result[1] = fVar14 * (float)auVar4._0_4_ + result[1];
            result[2] = fVar14 * (float)auVar6._8_4_ + result[2];
            result[3] = fVar14 * (float)uVar12 + result[3];
          }
          fVar15 = fVar15 + fVar13;
          fVar13 = fVar13 + fVar2 + fVar2;
          puVar11 = puVar11 + 1;
        } while (puVar11 < puVar1);
        iVar7 = k->v2;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar7);
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }